

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall irr::gui::CGUITabControl::scrollRight(CGUITabControl *this)

{
  bool bVar1;
  u32 uVar2;
  long in_RDI;
  s32 *in_stack_00000038;
  bool in_stack_00000043;
  s32 in_stack_00000044;
  CGUITabControl *in_stack_00000048;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  iVar3 = *(int *)(in_RDI + 0x17c);
  uVar2 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3d0278);
  if ((iVar3 < (int)(uVar2 - 1)) &&
     (bVar1 = needScrollControl(in_stack_00000048,in_stack_00000044,in_stack_00000043,
                                in_stack_00000038), bVar1)) {
    *(int *)(in_RDI + 0x17c) = *(int *)(in_RDI + 0x17c) + 1;
  }
  recalculateScrollBar((CGUITabControl *)CONCAT44(iVar3,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void CGUITabControl::scrollRight()
{
	if (CurrentScrollTabIndex < (s32)(Tabs.size()) - 1) {
		if (needScrollControl(CurrentScrollTabIndex, true))
			++CurrentScrollTabIndex;
	}
	recalculateScrollBar();
}